

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O0

void __thiscall wallet::wallet_tests::importwallet_rescan::test_method(importwallet_rescan *this)

{
  uint256 block_hash;
  uint256 block_hash_00;
  bool bVar1;
  int iVar2;
  int64_t iVar3;
  LegacyScriptPubKeyMan *pLVar4;
  mapped_type *pmVar5;
  element_type *this_00;
  size_type sVar6;
  CWalletTx *this_01;
  lazy_ostream *plVar7;
  long in_RDI;
  long in_FS_OFFSET;
  size_t i;
  LegacyScriptPubKeyMan *spk_man;
  int64_t KEY_TIME;
  int64_t BLOCK_TIME;
  bool expected;
  bool found;
  WalletContext context_1;
  shared_ptr<wallet::CWallet> wallet_1;
  shared_ptr<wallet::CWallet> wallet;
  WalletContext context;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock36;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock35;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock34;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  JSONRPCRequest request_1;
  JSONRPCRequest request;
  string backup_file;
  ChainstateManager *in_stack_fffffffffffff148;
  char *this_02;
  ArgsManager *in_stack_fffffffffffff150;
  lazy_ostream *prev;
  CWallet *in_stack_fffffffffffff158;
  char *this_03;
  path *in_stack_fffffffffffff160;
  CWallet *this_04;
  undefined4 in_stack_fffffffffffff168;
  int in_stack_fffffffffffff16c;
  undefined7 in_stack_fffffffffffff170;
  undefined1 in_stack_fffffffffffff177;
  undefined4 in_stack_fffffffffffff178;
  int in_stack_fffffffffffff17c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff180;
  const_string *file;
  Chainstate *in_stack_fffffffffffff188;
  CPubKey *in_stack_fffffffffffff190;
  vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *in_stack_fffffffffffff198;
  _Optional_payload_base<bool> load_on_start;
  TestChain100Setup *in_stack_fffffffffffff1a0;
  CWallet *in_stack_fffffffffffff1a8;
  ulong uVar8;
  undefined4 in_stack_fffffffffffff250;
  ulong local_d08;
  undefined1 local_cc8 [16];
  undefined1 local_cb8 [66];
  undefined1 local_c76 [6];
  size_type local_c70;
  undefined1 local_c68 [16];
  undefined1 local_c58 [68];
  lazy_ostream local_c14;
  undefined1 local_bf8 [70];
  optional<bool> local_bb2;
  undefined1 *local_bb0;
  undefined1 local_ba8 [16];
  long local_b98;
  pointer local_b30;
  optional<bool> local_b12;
  undefined1 *local_b10;
  pointer local_b00;
  undefined1 local_ae8 [16];
  long local_ad8;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined8 local_a48;
  undefined8 local_a38;
  undefined8 uStack_a30;
  undefined8 local_a28;
  JSONRPCRequest *local_8b8;
  lazy_ostream *plStack_8b0;
  CWallet *local_8a8;
  CWallet *pCStack_8a0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  ChainstateManager *local_3f0;
  WalletContext **ppWStack_3e8;
  CWallet *local_3e0;
  UniValue *pUStack_3d8;
  undefined1 local_3ce [150];
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_fffffffffffff188,(char *)in_stack_fffffffffffff180,in_stack_fffffffffffff17c,
             (char *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170),
             (char *)CONCAT44(in_stack_fffffffffffff16c,in_stack_fffffffffffff168));
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_fffffffffffff148);
  ChainstateManager::GetMutex(in_stack_fffffffffffff148);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff148);
  iVar3 = test_method::anon_class_8_1_8991fb9c::operator()
                    ((anon_class_8_1_8991fb9c *)in_stack_fffffffffffff188);
  SetMockTime((int64_t)in_stack_fffffffffffff148);
  local_a38 = 0;
  uStack_a30 = 0;
  local_a28 = 0;
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::vector
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)
             in_stack_fffffffffffff148);
  CKey::GetPubKey((CKey *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170));
  GetScriptForRawPubKey(in_stack_fffffffffffff190);
  TestChain100Setup::CreateAndProcessBlock
            (in_stack_fffffffffffff1a0,in_stack_fffffffffffff198,
             (CScript *)in_stack_fffffffffffff190,in_stack_fffffffffffff188);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)in_stack_fffffffffffff158,(size_type)in_stack_fffffffffffff150);
  std::
  vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>::
  emplace_back<std::shared_ptr<CTransaction_const>&>
            ((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              *)CONCAT44(in_stack_fffffffffffff16c,in_stack_fffffffffffff168),
             (shared_ptr<const_CTransaction> *)in_stack_fffffffffffff160);
  CBlock::~CBlock((CBlock *)in_stack_fffffffffffff148);
  CScript::~CScript((CScript *)in_stack_fffffffffffff148);
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::~vector
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)
             in_stack_fffffffffffff158);
  local_a58 = 0;
  uStack_a50 = 0;
  local_a48 = 0;
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::vector
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)
             in_stack_fffffffffffff148);
  CKey::GetPubKey((CKey *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170));
  GetScriptForRawPubKey(in_stack_fffffffffffff190);
  TestChain100Setup::CreateAndProcessBlock
            (in_stack_fffffffffffff1a0,in_stack_fffffffffffff198,
             (CScript *)in_stack_fffffffffffff190,in_stack_fffffffffffff188);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)in_stack_fffffffffffff158,(size_type)in_stack_fffffffffffff150);
  std::
  vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>::
  emplace_back<std::shared_ptr<CTransaction_const>&>
            ((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              *)CONCAT44(in_stack_fffffffffffff16c,in_stack_fffffffffffff168),
             (shared_ptr<const_CTransaction> *)in_stack_fffffffffffff160);
  CBlock::~CBlock((CBlock *)in_stack_fffffffffffff148);
  CScript::~CScript((CScript *)in_stack_fffffffffffff148);
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::~vector
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)
             in_stack_fffffffffffff158);
  SetMockTime((int64_t)in_stack_fffffffffffff148);
  local_a78 = 0;
  uStack_a70 = 0;
  local_a68 = 0;
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::vector
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)
             in_stack_fffffffffffff148);
  CKey::GetPubKey((CKey *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170));
  GetScriptForRawPubKey(in_stack_fffffffffffff190);
  TestChain100Setup::CreateAndProcessBlock
            (in_stack_fffffffffffff1a0,in_stack_fffffffffffff198,
             (CScript *)in_stack_fffffffffffff190,in_stack_fffffffffffff188);
  load_on_start = SUB82((ulong)in_stack_fffffffffffff198 >> 0x30,0);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)in_stack_fffffffffffff158,(size_type)in_stack_fffffffffffff150);
  std::
  vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>::
  emplace_back<std::shared_ptr<CTransaction_const>&>
            ((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              *)CONCAT44(in_stack_fffffffffffff16c,in_stack_fffffffffffff168),
             (shared_ptr<const_CTransaction> *)in_stack_fffffffffffff160);
  CBlock::~CBlock((CBlock *)in_stack_fffffffffffff148);
  CScript::~CScript((CScript *)in_stack_fffffffffffff148);
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::~vector
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)
             in_stack_fffffffffffff158);
  ArgsManager::GetDataDirNet(in_stack_fffffffffffff150);
  fs::operator/(in_stack_fffffffffffff160,(char *)in_stack_fffffffffffff158);
  fs::PathToString_abi_cxx11_((path *)in_stack_fffffffffffff150);
  fs::path::~path((path *)in_stack_fffffffffffff148);
  fs::path::~path((path *)in_stack_fffffffffffff148);
  WalletContext::WalletContext((WalletContext *)in_stack_fffffffffffff148);
  local_ad8 = in_RDI + 0x1f0;
  local_b00 = std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>::get
                        ((unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)
                         in_stack_fffffffffffff148);
  local_318 = 0;
  uStack_310 = 0;
  local_328 = 0;
  uStack_320 = 0;
  local_338 = 0;
  uStack_330 = 0;
  std::
  map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::map((map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
         *)in_stack_fffffffffffff148);
  CreateMockableWalletDatabase((MockableData *)in_stack_fffffffffffff158);
  std::
  make_shared<wallet::CWallet,interfaces::Chain*,char_const(&)[1],std::unique_ptr<wallet::WalletDatabase,std::default_delete<wallet::WalletDatabase>>>
            ((Chain **)in_stack_fffffffffffff188,(char (*) [1])in_stack_fffffffffffff180,
             (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *)
             CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
  std::unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>::~unique_ptr
            ((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *)
             in_stack_fffffffffffff158);
  std::
  map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::~map((map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
          *)in_stack_fffffffffffff148);
  std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffff148);
  pLVar4 = CWallet::GetOrCreateLegacyScriptPubKeyMan(in_stack_fffffffffffff158);
  std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffff148);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff148);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffff188,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff180,
             (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178),
             (char *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170),
             in_stack_fffffffffffff16c,SUB41((uint)in_stack_fffffffffffff168 >> 0x18,0));
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff148);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffff188,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff180,
             (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178),
             (char *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170),
             in_stack_fffffffffffff16c,SUB41((uint)in_stack_fffffffffffff168 >> 0x18,0));
  CKey::GetPubKey((CKey *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170));
  CPubKey::GetID((CPubKey *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170));
  pmVar5 = std::
           map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
           ::operator[]((map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
                         *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170),
                        (key_type *)CONCAT44(in_stack_fffffffffffff16c,in_stack_fffffffffffff168));
  pmVar5->nCreateTime = iVar3 + 0x1c20;
  CKey::GetPubKey((CKey *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170));
  (*(pLVar4->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0x23])
            (pLVar4,in_RDI + 0x4a0,local_3ce);
  AddWallet((WalletContext *)in_stack_fffffffffffff188,
            (shared_ptr<wallet::CWallet> *)in_stack_fffffffffffff180);
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_fffffffffffff188,(char *)in_stack_fffffffffffff180,in_stack_fffffffffffff17c,
             (char *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170),
             (char *)CONCAT44(in_stack_fffffffffffff16c,in_stack_fffffffffffff168));
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_fffffffffffff148);
  ChainstateManager::GetMutex(in_stack_fffffffffffff148);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff148);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffff188,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff180,
             (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178),
             (char *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170),
             in_stack_fffffffffffff16c,SUB41((uint)in_stack_fffffffffffff168 >> 0x18,0));
  this_00 = std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)in_stack_fffffffffffff148);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_fffffffffffff148);
  ChainstateManager::ActiveChain(in_stack_fffffffffffff148);
  iVar2 = CChain::Height((CChain *)in_stack_fffffffffffff148);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_fffffffffffff148);
  ChainstateManager::ActiveChain(in_stack_fffffffffffff148);
  CChain::Tip((CChain *)in_stack_fffffffffffff158);
  CBlockIndex::GetBlockHash((CBlockIndex *)in_stack_fffffffffffff158);
  block_hash.super_base_blob<256U>.m_data._M_elems[7] = in_stack_fffffffffffff177;
  block_hash.super_base_blob<256U>.m_data._M_elems[0] = (char)in_stack_fffffffffffff170;
  block_hash.super_base_blob<256U>.m_data._M_elems[1] =
       (char)((uint7)in_stack_fffffffffffff170 >> 8);
  block_hash.super_base_blob<256U>.m_data._M_elems[2] =
       (char)((uint7)in_stack_fffffffffffff170 >> 0x10);
  block_hash.super_base_blob<256U>.m_data._M_elems[3] =
       (char)((uint7)in_stack_fffffffffffff170 >> 0x18);
  block_hash.super_base_blob<256U>.m_data._M_elems[4] =
       (char)((uint7)in_stack_fffffffffffff170 >> 0x20);
  block_hash.super_base_blob<256U>.m_data._M_elems[5] =
       (char)((uint7)in_stack_fffffffffffff170 >> 0x28);
  block_hash.super_base_blob<256U>.m_data._M_elems[6] =
       (char)((uint7)in_stack_fffffffffffff170 >> 0x30);
  block_hash.super_base_blob<256U>.m_data._M_elems[8] = (char)in_stack_fffffffffffff178;
  block_hash.super_base_blob<256U>.m_data._M_elems[9] = (char)((uint)in_stack_fffffffffffff178 >> 8)
  ;
  block_hash.super_base_blob<256U>.m_data._M_elems[10] =
       (char)((uint)in_stack_fffffffffffff178 >> 0x10);
  block_hash.super_base_blob<256U>.m_data._M_elems[0xb] =
       (char)((uint)in_stack_fffffffffffff178 >> 0x18);
  block_hash.super_base_blob<256U>.m_data._M_elems[0xc] = (char)in_stack_fffffffffffff17c;
  block_hash.super_base_blob<256U>.m_data._M_elems[0xd] =
       (char)((uint)in_stack_fffffffffffff17c >> 8);
  block_hash.super_base_blob<256U>.m_data._M_elems[0xe] =
       (char)((uint)in_stack_fffffffffffff17c >> 0x10);
  block_hash.super_base_blob<256U>.m_data._M_elems[0xf] =
       (char)((uint)in_stack_fffffffffffff17c >> 0x18);
  block_hash.super_base_blob<256U>.m_data._M_elems._16_8_ = in_stack_fffffffffffff180;
  block_hash.super_base_blob<256U>.m_data._M_elems._24_8_ = in_stack_fffffffffffff188;
  CWallet::SetLastBlockProcessed(local_3e0,(int)((ulong)ppWStack_3e8 >> 0x20),block_hash);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)local_3f0);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)local_3f0);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)local_3f0);
  JSONRPCRequest::JSONRPCRequest
            ((JSONRPCRequest *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170));
  local_b10 = local_ae8;
  std::any::operator=((any *)local_3e0,ppWStack_3e8);
  UniValue::setArray((UniValue *)local_3f0);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ((UniValue *)in_stack_fffffffffffff188,in_stack_fffffffffffff180);
  UniValue::push_back(pUStack_3d8,(UniValue *)local_3e0);
  UniValue::~UniValue((UniValue *)local_3f0);
  dumpwallet();
  RPCHelpMan::HandleRequest
            ((RPCHelpMan *)this_00,(JSONRPCRequest *)CONCAT44(iVar2,in_stack_fffffffffffff250));
  UniValue::~UniValue((UniValue *)local_3f0);
  RPCHelpMan::~RPCHelpMan((RPCHelpMan *)local_3f0);
  std::optional<bool>::optional(&local_b12);
  RemoveWallet((WalletContext *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170),
               (shared_ptr<wallet::CWallet> *)
               CONCAT44(in_stack_fffffffffffff16c,in_stack_fffffffffffff168),
               (optional<bool>)load_on_start);
  JSONRPCRequest::~JSONRPCRequest((JSONRPCRequest *)local_3f0);
  std::shared_ptr<wallet::CWallet>::~shared_ptr((shared_ptr<wallet::CWallet> *)local_3f0);
  WalletContext::~WalletContext((WalletContext *)local_3f0);
  local_b30 = std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>::get
                        ((unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)
                         local_3f0);
  local_6c8 = 0;
  uStack_6c0 = 0;
  local_6d8 = 0;
  uStack_6d0 = 0;
  local_6e8 = 0;
  uStack_6e0 = 0;
  std::
  map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::map((map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
         *)local_3f0);
  CreateMockableWalletDatabase((MockableData *)local_3e0);
  std::
  make_shared<wallet::CWallet,interfaces::Chain*,char_const(&)[1],std::unique_ptr<wallet::WalletDatabase,std::default_delete<wallet::WalletDatabase>>>
            ((Chain **)in_stack_fffffffffffff188,(char (*) [1])in_stack_fffffffffffff180,
             (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *)
             CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
  std::unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>::~unique_ptr
            ((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *)
             local_3e0);
  std::
  map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::~map((map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
          *)local_3f0);
  std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_3f0);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)local_3f0);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffff188,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff180,
             (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178),
             (char *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170),
             in_stack_fffffffffffff16c,SUB41((uint)in_stack_fffffffffffff168 >> 0x18,0));
  std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_3f0);
  CWallet::SetupLegacyScriptPubKeyMan(in_stack_fffffffffffff1a8);
  WalletContext::WalletContext((WalletContext *)local_3f0);
  local_b98 = in_RDI + 0x1f0;
  JSONRPCRequest::JSONRPCRequest
            ((JSONRPCRequest *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170));
  local_bb0 = local_ba8;
  std::any::operator=((any *)local_3e0,ppWStack_3e8);
  UniValue::setArray((UniValue *)local_3f0);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ((UniValue *)in_stack_fffffffffffff188,in_stack_fffffffffffff180);
  UniValue::push_back(pUStack_3d8,(UniValue *)local_3e0);
  UniValue::~UniValue((UniValue *)local_3f0);
  AddWallet((WalletContext *)in_stack_fffffffffffff188,
            (shared_ptr<wallet::CWallet> *)in_stack_fffffffffffff180);
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_fffffffffffff188,(char *)in_stack_fffffffffffff180,in_stack_fffffffffffff17c,
             (char *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170),
             (char *)CONCAT44(in_stack_fffffffffffff16c,in_stack_fffffffffffff168));
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)local_3f0);
  ChainstateManager::GetMutex(local_3f0);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)local_3f0);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffff188,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff180,
             (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178),
             (char *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170),
             in_stack_fffffffffffff16c,SUB41((uint)in_stack_fffffffffffff168 >> 0x18,0));
  std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_3f0);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)local_3f0);
  ChainstateManager::ActiveChain(local_3f0);
  CChain::Height((CChain *)local_3f0);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)local_3f0);
  ChainstateManager::ActiveChain(local_3f0);
  CChain::Tip((CChain *)local_3e0);
  CBlockIndex::GetBlockHash((CBlockIndex *)local_3e0);
  block_hash_00.super_base_blob<256U>.m_data._M_elems[7] = in_stack_fffffffffffff177;
  block_hash_00.super_base_blob<256U>.m_data._M_elems[0] = (char)in_stack_fffffffffffff170;
  block_hash_00.super_base_blob<256U>.m_data._M_elems[1] =
       (char)((uint7)in_stack_fffffffffffff170 >> 8);
  block_hash_00.super_base_blob<256U>.m_data._M_elems[2] =
       (char)((uint7)in_stack_fffffffffffff170 >> 0x10);
  block_hash_00.super_base_blob<256U>.m_data._M_elems[3] =
       (char)((uint7)in_stack_fffffffffffff170 >> 0x18);
  block_hash_00.super_base_blob<256U>.m_data._M_elems[4] =
       (char)((uint7)in_stack_fffffffffffff170 >> 0x20);
  block_hash_00.super_base_blob<256U>.m_data._M_elems[5] =
       (char)((uint7)in_stack_fffffffffffff170 >> 0x28);
  block_hash_00.super_base_blob<256U>.m_data._M_elems[6] =
       (char)((uint7)in_stack_fffffffffffff170 >> 0x30);
  block_hash_00.super_base_blob<256U>.m_data._M_elems[8] = (char)in_stack_fffffffffffff178;
  block_hash_00.super_base_blob<256U>.m_data._M_elems[9] =
       (char)((uint)in_stack_fffffffffffff178 >> 8);
  block_hash_00.super_base_blob<256U>.m_data._M_elems[10] =
       (char)((uint)in_stack_fffffffffffff178 >> 0x10);
  block_hash_00.super_base_blob<256U>.m_data._M_elems[0xb] =
       (char)((uint)in_stack_fffffffffffff178 >> 0x18);
  block_hash_00.super_base_blob<256U>.m_data._M_elems[0xc] = (char)in_stack_fffffffffffff17c;
  block_hash_00.super_base_blob<256U>.m_data._M_elems[0xd] =
       (char)((uint)in_stack_fffffffffffff17c >> 8);
  block_hash_00.super_base_blob<256U>.m_data._M_elems[0xe] =
       (char)((uint)in_stack_fffffffffffff17c >> 0x10);
  block_hash_00.super_base_blob<256U>.m_data._M_elems[0xf] =
       (char)((uint)in_stack_fffffffffffff17c >> 0x18);
  block_hash_00.super_base_blob<256U>.m_data._M_elems._16_8_ = in_stack_fffffffffffff180;
  block_hash_00.super_base_blob<256U>.m_data._M_elems._24_8_ = in_stack_fffffffffffff188;
  CWallet::SetLastBlockProcessed(local_8a8,(int)((ulong)plStack_8b0 >> 0x20),block_hash_00);
  importwallet();
  RPCHelpMan::HandleRequest
            ((RPCHelpMan *)this_00,(JSONRPCRequest *)CONCAT44(iVar2,in_stack_fffffffffffff250));
  UniValue::~UniValue((UniValue *)local_8b8);
  RPCHelpMan::~RPCHelpMan((RPCHelpMan *)local_8b8);
  std::optional<bool>::optional(&local_bb2);
  RemoveWallet((WalletContext *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170),
               (shared_ptr<wallet::CWallet> *)
               CONCAT44(in_stack_fffffffffffff16c,in_stack_fffffffffffff168),
               (optional<bool>)load_on_start);
  this_02 = (char *)local_8b8;
  prev = plStack_8b0;
  this_03 = (char *)local_8a8;
  this_04 = pCStack_8a0;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,(pointer)prev,(unsigned_long)this_02);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_02)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff188,
               (const_string *)in_stack_fffffffffffff180,
               CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178),
               (const_string *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(prev,(char (*) [1])this_02);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,(pointer)prev,(unsigned_long)this_02);
    std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               this_02);
    local_c14._4_8_ =
         std::
         unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
         ::size((unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
                 *)this_02);
    local_c14._vptr_lazy_ostream._0_4_ = 3;
    this_03 = "3U";
    prev = &local_c14;
    this_02 = "wallet->mapWallet.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_bf8,&local_c14.field_0xc,0x143,1,2,
               (undefined1 *)((long)&local_c14._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               this_02);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,(pointer)prev,(unsigned_long)this_02);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_02)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff188,
               (const_string *)in_stack_fffffffffffff180,
               CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178),
               (const_string *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(prev,(char (*) [1])this_02);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,(pointer)prev,(unsigned_long)this_02);
    local_c70 = std::
                vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        *)this_02);
    local_c76._2_4_ = 0x67;
    this_03 = "103U";
    prev = (lazy_ostream *)(local_c76 + 2);
    this_02 = "m_coinbase_txns.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_c58,local_c68,0x144,1,2,&local_c70);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               this_02);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  local_d08 = 0;
  while (uVar8 = local_d08,
        sVar6 = std::
                vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        *)this_02), uVar8 < sVar6) {
    std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               this_02);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)this_03,(size_type)prev);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               this_02);
    CTransaction::GetHash((CTransaction *)this_02);
    transaction_identifier::operator_cast_to_uint256_((transaction_identifier<false> *)this_02);
    this_01 = CWallet::GetWalletTx(this_04,(uint256 *)this_03);
    local_c76[1] = this_01 != (CWalletTx *)0x0;
    local_c76[0] = 99 < local_d08;
    do {
      file = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_03,(pointer)prev,(unsigned_long)this_02);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)this_02);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)this_01,file,
                 CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178),
                 (const_string *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170));
      plVar7 = boost::unit_test::lazy_ostream::instance();
      in_stack_fffffffffffff178 = SUB84(plVar7,0);
      in_stack_fffffffffffff17c = (int)((ulong)plVar7 >> 0x20);
      boost::unit_test::operator<<(prev,(char (*) [1])this_02);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_03,(pointer)prev,(unsigned_long)this_02);
      this_03 = "expected";
      prev = (lazy_ostream *)local_c76;
      this_02 = "found";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
                (local_cb8,local_cc8,0x148,1,2,local_c76 + 1);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)this_02);
      in_stack_fffffffffffff177 = boost::test_tools::tt_detail::dummy_cond();
    } while ((bool)in_stack_fffffffffffff177);
    local_d08 = local_d08 + 1;
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)this_02);
  JSONRPCRequest::~JSONRPCRequest((JSONRPCRequest *)this_02);
  WalletContext::~WalletContext((WalletContext *)this_02);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)this_02);
  std::shared_ptr<wallet::CWallet>::~shared_ptr((shared_ptr<wallet::CWallet> *)this_02);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_02);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_FIXTURE_TEST_CASE(importwallet_rescan, TestChain100Setup)
{
    // Create two blocks with same timestamp to verify that importwallet rescan
    // will pick up both blocks, not just the first.
    const int64_t BLOCK_TIME = WITH_LOCK(Assert(m_node.chainman)->GetMutex(), return m_node.chainman->ActiveChain().Tip()->GetBlockTimeMax() + 5);
    SetMockTime(BLOCK_TIME);
    m_coinbase_txns.emplace_back(CreateAndProcessBlock({}, GetScriptForRawPubKey(coinbaseKey.GetPubKey())).vtx[0]);
    m_coinbase_txns.emplace_back(CreateAndProcessBlock({}, GetScriptForRawPubKey(coinbaseKey.GetPubKey())).vtx[0]);

    // Set key birthday to block time increased by the timestamp window, so
    // rescan will start at the block time.
    const int64_t KEY_TIME = BLOCK_TIME + TIMESTAMP_WINDOW;
    SetMockTime(KEY_TIME);
    m_coinbase_txns.emplace_back(CreateAndProcessBlock({}, GetScriptForRawPubKey(coinbaseKey.GetPubKey())).vtx[0]);

    std::string backup_file = fs::PathToString(m_args.GetDataDirNet() / "wallet.backup");

    // Import key into wallet and call dumpwallet to create backup file.
    {
        WalletContext context;
        context.args = &m_args;
        const std::shared_ptr<CWallet> wallet = std::make_shared<CWallet>(m_node.chain.get(), "", CreateMockableWalletDatabase());
        {
            auto spk_man = wallet->GetOrCreateLegacyScriptPubKeyMan();
            LOCK2(wallet->cs_wallet, spk_man->cs_KeyStore);
            spk_man->mapKeyMetadata[coinbaseKey.GetPubKey().GetID()].nCreateTime = KEY_TIME;
            spk_man->AddKeyPubKey(coinbaseKey, coinbaseKey.GetPubKey());

            AddWallet(context, wallet);
            LOCK(Assert(m_node.chainman)->GetMutex());
            wallet->SetLastBlockProcessed(m_node.chainman->ActiveChain().Height(), m_node.chainman->ActiveChain().Tip()->GetBlockHash());
        }
        JSONRPCRequest request;
        request.context = &context;
        request.params.setArray();
        request.params.push_back(backup_file);

        wallet::dumpwallet().HandleRequest(request);
        RemoveWallet(context, wallet, /* load_on_start= */ std::nullopt);
    }

    // Call importwallet RPC and verify all blocks with timestamps >= BLOCK_TIME
    // were scanned, and no prior blocks were scanned.
    {
        const std::shared_ptr<CWallet> wallet = std::make_shared<CWallet>(m_node.chain.get(), "", CreateMockableWalletDatabase());
        LOCK(wallet->cs_wallet);
        wallet->SetupLegacyScriptPubKeyMan();

        WalletContext context;
        context.args = &m_args;
        JSONRPCRequest request;
        request.context = &context;
        request.params.setArray();
        request.params.push_back(backup_file);
        AddWallet(context, wallet);
        LOCK(Assert(m_node.chainman)->GetMutex());
        wallet->SetLastBlockProcessed(m_node.chainman->ActiveChain().Height(), m_node.chainman->ActiveChain().Tip()->GetBlockHash());
        wallet::importwallet().HandleRequest(request);
        RemoveWallet(context, wallet, /* load_on_start= */ std::nullopt);

        BOOST_CHECK_EQUAL(wallet->mapWallet.size(), 3U);
        BOOST_CHECK_EQUAL(m_coinbase_txns.size(), 103U);
        for (size_t i = 0; i < m_coinbase_txns.size(); ++i) {
            bool found = wallet->GetWalletTx(m_coinbase_txns[i]->GetHash());
            bool expected = i >= 100;
            BOOST_CHECK_EQUAL(found, expected);
        }
    }
}